

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

_Bool square_isinemptysquare(chunk *c,loc_conflict grid)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  wchar_t local_28;
  wchar_t wStack_24;
  loc_conflict test;
  chunk *c_local;
  wchar_t wStack_10;
  loc_conflict grid_local;
  
  wStack_10 = grid.y;
  wStack_24 = wStack_10 + L'\xfffffffe';
  do {
    if (wStack_10 + L'\x02' < wStack_24) {
      return true;
    }
    c_local._4_4_ = grid.x;
    for (local_28 = c_local._4_4_ + L'\xfffffffe'; local_28 <= c_local._4_4_ + L'\x02';
        local_28 = local_28 + L'\x01') {
      grid_00.y = wStack_24;
      grid_00.x = local_28;
      _Var1 = square_in_bounds(c,grid_00);
      if (!_Var1) {
        return false;
      }
      grid_01.y = wStack_24;
      grid_01.x = local_28;
      _Var1 = square_isfloor(c,grid_01);
      if (!_Var1) {
        return false;
      }
    }
    wStack_24 = wStack_24 + L'\x01';
  } while( true );
}

Assistant:

bool square_isinemptysquare(struct chunk *c, struct loc grid)
{
	struct loc test;
	for (test.y = grid.y - 2; test.y <= grid.y + 2; test.y++) {
		for (test.x = grid.x - 2; test.x <= grid.x + 2; test.x++) {
			if (!square_in_bounds(c, test)) return false;
			if (!square_isfloor(c, test)) return false;
		}
	}
	return true;
}